

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O1

void __thiscall PSEngine::load_level_internal(PSEngine *this,int p_level_idx)

{
  _Atomic_word *p_Var1;
  pointer pLVar2;
  pointer pCVar3;
  pointer *ppCVar4;
  int iVar5;
  pointer pLVar6;
  pointer pLVar7;
  PSVector2i *pPVar8;
  element_type *peVar9;
  long lVar10;
  uint uVar11;
  char cVar12;
  int iVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar14;
  long *plVar15;
  PSVector2i *pPVar16;
  uint uVar17;
  pointer pCVar18;
  PSVector2i PVar19;
  _Base_ptr *pp_Var20;
  uint __val;
  char cVar21;
  pointer pCVar22;
  pointer pLVar23;
  ulong uVar24;
  uint __len;
  bool bVar25;
  Level compiled_level;
  string __str_1;
  string __str;
  PSVector2i local_138;
  vector<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_> local_130;
  undefined1 local_118 [8];
  PSVector2i PStack_110;
  undefined1 local_108 [8];
  pointer pCStack_100;
  pointer local_f8;
  pointer pCStack_f0;
  _Base_ptr local_e8;
  pointer *local_d8;
  uint local_d0;
  undefined4 uStack_cc;
  pointer local_c8 [2];
  undefined1 local_b8 [24];
  long lStack_a0;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *local_98;
  _Base_ptr *local_90;
  long local_88;
  _Base_ptr local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  _Base_ptr local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  if ((ulong)(long)p_level_idx <
      (ulong)((long)(this->m_compiled_game).levels.
                    super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_compiled_game).levels.
                    super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 5)) {
    pLVar6 = (this->m_level_state_stack).
             super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar7 = (this->m_level_state_stack).
             super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar23 = pLVar6;
    if (pLVar7 != pLVar6) {
      do {
        std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector(&pLVar23->cells);
        pLVar23 = pLVar23 + 1;
      } while (pLVar23 != pLVar7);
      (this->m_level_state_stack).
      super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>._M_impl.
      super__Vector_impl_data._M_finish = pLVar6;
    }
    this->m_is_level_won = false;
    this->m_current_tick_time_elapsed = 0.0;
    pLVar2 = (this->m_compiled_game).levels.
             super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>._M_impl.
             super__Vector_impl_data._M_start + p_level_idx;
    local_138.x = pLVar2->width;
    local_138.y = pLVar2->height;
    std::vector<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>::vector
              (&local_130,&pLVar2->cells);
    local_118._0_4_ = -1;
    local_118._4_4_ = 0;
    PStack_110.x = 0;
    PStack_110.y = 0;
    (this->m_current_level).size.y = 0;
    (this->m_current_level).level_idx = -1;
    (this->m_current_level).size.x = 0;
    local_b8._0_8_ =
         (this->m_current_level).cells.
         super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_b8._8_8_ =
         (this->m_current_level).cells.
         super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_b8._16_8_ =
         (this->m_current_level).cells.
         super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->m_current_level).cells.
    super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->m_current_level).cells.
    super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->m_current_level).cells.
    super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108._0_4_ = 0;
    local_108._4_4_ = 0;
    pCStack_100 = (pointer)0x0;
    local_f8 = (pointer)0x0;
    std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector
              ((vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *)local_b8);
    std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector
              ((vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *)local_108);
    (this->m_current_level).level_idx = p_level_idx;
    (this->m_current_level).size = local_138;
    if (local_130.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_130.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_98 = &(this->m_current_level).cells;
      uVar24 = 0;
      do {
        pCVar3 = local_130.
                 super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>._M_impl
                 .super__Vector_impl_data._M_start;
        local_108._0_4_ = 0;
        local_108._4_4_ = 0;
        pCStack_100 = (pointer)0x0;
        local_118._0_4_ = 0;
        local_118._4_4_ = 0;
        PStack_110.x = 0;
        PStack_110.y = 0;
        local_e8 = (_Base_ptr)0x0;
        local_f8 = (pointer)local_108;
        pCStack_f0 = local_f8;
        std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::emplace_back<PSEngine::Cell>
                  (local_98,(Cell *)local_118);
        std::
        _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                     *)&PStack_110);
        lVar10 = (long)(this->m_current_level).size.x;
        uVar14 = (ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff;
        (this->m_current_level).cells.
        super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].position =
             (PSVector2i)((long)uVar14 % lVar10 & 0xffffffffU | (long)uVar14 / lVar10 << 0x20);
        pPVar8 = (PSVector2i *)
                 pCVar3[uVar24].objects.
                 super__Vector_base<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pPVar16 = (PSVector2i *)
                       pCVar3[uVar24].objects.
                       super__Vector_base<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pPVar16 != pPVar8;
            pPVar16 = pPVar16 + 2) {
          local_118 = *(undefined1 (*) [8])pPVar16;
          PVar19 = pPVar16[1];
          if (PVar19 != (PSVector2i)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)PVar19 + 0xc) = *(_Atomic_word *)((long)PVar19 + 0xc) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)PVar19 + 0xc) = *(_Atomic_word *)((long)PVar19 + 0xc) + 1;
            }
          }
          pCVar18 = (this->m_current_level).cells.
                    super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          PStack_110 = PVar19;
          if (PVar19 != (PSVector2i)0x0) {
            iVar13 = *(_Atomic_word *)((long)PVar19 + 8);
            do {
              if (iVar13 == 0) {
                PStack_110.x = 0;
                PStack_110.y = 0;
                break;
              }
              LOCK();
              iVar5 = *(_Atomic_word *)((long)PVar19 + 8);
              bVar25 = iVar13 == iVar5;
              if (bVar25) {
                *(_Atomic_word *)((long)PVar19 + 8) = iVar13 + 1;
                iVar5 = iVar13;
              }
              iVar13 = iVar5;
              UNLOCK();
            } while (!bVar25);
          }
          if (PStack_110 == (PSVector2i)0x0) {
            local_118._0_4_ = 0;
            local_118._4_4_ = 0;
          }
          else if (*(_Atomic_word *)((long)PStack_110 + 8) == 0) {
            local_118._0_4_ = 0;
            local_118._4_4_ = 0;
          }
          local_108._0_4_ = 6;
          std::
          _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>,std::_Select1st<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
          ::
          _M_emplace_unique<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>,PSEngine::ObjectMoveType>>
                    ((_Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>,std::_Select1st<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
                      *)&pCVar18[-1].objects,
                     (pair<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *
                     )local_118);
          if (PStack_110 != (PSVector2i)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)PStack_110);
          }
          if (PVar19 != (PSVector2i)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = (_Atomic_word *)((long)PVar19 + 0xc);
              iVar13 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar13 = *(_Atomic_word *)((long)PVar19 + 0xc);
              *(int *)((long)PVar19 + 0xc) = iVar13 + -1;
            }
            if (iVar13 == 1) {
              (**(code **)(*(long *)PVar19 + 0x18))(PVar19);
            }
          }
        }
        uVar24 = uVar24 + 1;
        uVar14 = ((long)local_130.
                        super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_130.
                        super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      } while (uVar24 <= uVar14 && uVar14 - uVar24 != 0);
    }
    std::vector<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>::~vector(&local_130);
    return;
  }
  if (4 < (int)(this->m_config).log_verbosity) {
    return;
  }
  peVar9 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
             m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
             m_engine_log_cat_abi_cxx11_._M_string_length);
  __val = -p_level_idx;
  if (0 < p_level_idx) {
    __val = p_level_idx;
  }
  __len = 1;
  if (9 < __val) {
    uVar24 = (ulong)__val;
    uVar11 = 4;
    do {
      __len = uVar11;
      uVar17 = (uint)uVar24;
      if (uVar17 < 100) {
        __len = __len - 2;
        goto LAB_0010fabe;
      }
      if (uVar17 < 1000) {
        __len = __len - 1;
        goto LAB_0010fabe;
      }
      if (uVar17 < 10000) goto LAB_0010fabe;
      uVar24 = uVar24 / 10000;
      uVar11 = __len + 4;
    } while (99999 < uVar17);
    __len = __len + 1;
  }
LAB_0010fabe:
  local_70[0] = (_Base_ptr)local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)(p_level_idx >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)&local_70[0]->_M_color + (ulong)((uint)p_level_idx >> 0x1f)),__len,__val
            );
  plVar15 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x14cfc7);
  local_b8._0_8_ = local_b8 + 0x10;
  pCVar18 = (pointer)(plVar15 + 2);
  if ((pointer)*plVar15 == pCVar18) {
    local_b8._16_8_ = pCVar18->position;
    lStack_a0 = plVar15[3];
  }
  else {
    local_b8._16_8_ = pCVar18->position;
    local_b8._0_8_ = (pointer)*plVar15;
  }
  local_b8._8_8_ = plVar15[1];
  *plVar15 = (long)pCVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  pPVar16 = (PSVector2i *)std::__cxx11::string::append(local_b8);
  ppCVar4 = &local_130.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  PVar19 = (PSVector2i)(pPVar16 + 2);
  if (*pPVar16 == PVar19) {
    local_130.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>._M_impl.
    super__Vector_impl_data._M_finish = *(pointer *)PVar19;
    local_130.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)(pPVar16 + 3);
    local_138 = (PSVector2i)ppCVar4;
  }
  else {
    local_130.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>._M_impl.
    super__Vector_impl_data._M_finish = *(pointer *)PVar19;
    local_138 = *pPVar16;
  }
  local_130.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)(pPVar16 + 1);
  *pPVar16 = PVar19;
  pPVar16[1].x = 0;
  pPVar16[1].y = 0;
  *(undefined1 *)&pPVar16[2].x = 0;
  uVar24 = (long)(this->m_compiled_game).levels.
                 super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_compiled_game).levels.
                 super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 5;
  cVar21 = '\x01';
  if (9 < uVar24) {
    uVar14 = uVar24;
    cVar12 = '\x04';
    do {
      cVar21 = cVar12;
      if (uVar14 < 100) {
        cVar21 = cVar21 + -2;
        goto LAB_0010fc2e;
      }
      if (uVar14 < 1000) {
        cVar21 = cVar21 + -1;
        goto LAB_0010fc2e;
      }
      if (uVar14 < 10000) goto LAB_0010fc2e;
      bVar25 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar12 = cVar21 + '\x04';
    } while (bVar25);
    cVar21 = cVar21 + '\x01';
  }
LAB_0010fc2e:
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct((ulong)&local_d8,cVar21);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d8,local_d0,uVar24);
  pCVar3 = (pointer)((long)local_130.
                           super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>
                           ._M_impl.super__Vector_impl_data._M_start + CONCAT44(uStack_cc,local_d0))
  ;
  pCVar22 = (pointer)0xf;
  if (local_138 != (PSVector2i)ppCVar4) {
    pCVar22 = local_130.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (pCVar22 < pCVar3) {
    pCVar22 = (pointer)0xf;
    if (local_d8 != local_c8) {
      pCVar22 = local_c8[0];
    }
    if (pCVar3 <= pCVar22) {
      pPVar16 = (PSVector2i *)
                std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_138);
      goto LAB_0010fcbb;
    }
  }
  pPVar16 = (PSVector2i *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_d8);
LAB_0010fcbb:
  local_118 = (undefined1  [8])local_108;
  PVar19 = (PSVector2i)(pPVar16 + 2);
  if (*pPVar16 == PVar19) {
    local_108 = *(undefined1 (*) [8])PVar19;
    pCStack_100 = *(pointer *)(pPVar16 + 3);
  }
  else {
    local_108 = *(undefined1 (*) [8])PVar19;
    local_118 = (undefined1  [8])*pPVar16;
  }
  PStack_110 = pPVar16[1];
  *pPVar16 = PVar19;
  pPVar16[1].x = 0;
  pPVar16[1].y = 0;
  *(undefined1 *)PVar19 = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_118);
  pp_Var20 = (_Base_ptr *)(plVar15 + 2);
  if ((_Base_ptr *)*plVar15 == pp_Var20) {
    local_80 = *pp_Var20;
    uStack_78 = (undefined4)plVar15[3];
    uStack_74 = *(undefined4 *)((long)plVar15 + 0x1c);
    local_90 = &local_80;
  }
  else {
    local_80 = *pp_Var20;
    local_90 = (_Base_ptr *)*plVar15;
  }
  local_88 = plVar15[1];
  *plVar15 = (long)pp_Var20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  (*peVar9->_vptr_PSLogger[2])(peVar9,4,local_50);
  if (local_90 != &local_80) {
    operator_delete(local_90,(ulong)((long)&local_80->_M_color + 1));
  }
  if (local_118 != (undefined1  [8])local_108) {
    operator_delete((void *)local_118,(ulong)((long)local_108 + 1));
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,(ulong)((long)&(local_c8[0]->objects).
                                            super__Vector_base<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (local_138 != (PSVector2i)ppCVar4) {
    operator_delete((void *)local_138,
                    (ulong)((long)&((local_130.
                                     super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->objects).
                                   super__Vector_base<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  if (local_70[0] != (_Base_ptr)local_60) {
    operator_delete(local_70[0],local_60._0_8_ + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((this->m_config).log_operation_history_after_error == true) {
    print_operation_history(this);
  }
  return;
}

Assistant:

void PSEngine::load_level_internal(int p_level_idx)
{
    if(p_level_idx >= m_compiled_game.levels.size())
    {
        PS_LOG_ERROR("Cannot load level "+to_string(p_level_idx)+", there's only "+to_string(m_compiled_game.levels.size())+" levels.");
        return;
    }
    m_level_state_stack.clear();
    m_is_level_won = false;
    m_current_tick_time_elapsed = 0;

    CompiledGame::Level compiled_level = m_compiled_game.levels[p_level_idx];

    m_current_level = Level();

    m_current_level.level_idx = p_level_idx;
    m_current_level.size = PSVector2i(compiled_level.width, compiled_level.height);


    for(int i = 0; i < compiled_level.cells.size(); ++i)
    {
        const auto& cell = compiled_level.cells[i];

        m_current_level.cells.push_back(Cell());

        m_current_level.cells.back().position = PSVector2i( i % m_current_level.size.x, i / m_current_level.size.x);

        for(weak_ptr<CompiledGame::PrimaryObject> obj : cell.objects)
        {
            m_current_level.cells.back().objects.insert(make_pair(obj.lock(),ObjectMoveType::Stationary));
        }
    }
}